

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateOptions
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FileDescriptor *pFVar1;
  int index;
  string_view element_name;
  FileDescriptor *file_local;
  int local_4c;
  VoidPtr local_48;
  code *pcStack_40;
  FileDescriptor **local_38;
  int *local_30;
  
  file_local = file;
  ValidateFileFeatures(this,file,proto);
  if (((file == (FileDescriptor *)0x0) ||
      (file->options_ == (FileOptions *)_FileOptions_default_instance_)) ||
     ((file->options_->field_0)._impl_.optimize_for_ != 3)) {
    for (index = 0; index < file->dependency_count_; index = index + 1) {
      pFVar1 = FileDescriptor::dependency(file,index);
      if (((pFVar1 != (FileDescriptor *)0x0) &&
          (pFVar1->options_ != (FileOptions *)_FileOptions_default_instance_)) &&
         ((pFVar1->options_->field_0)._impl_.optimize_for_ == 3)) {
        local_4c = index;
        pFVar1 = FileDescriptor::dependency(file,index);
        local_38 = &file_local;
        local_48.obj = &local_38;
        pcStack_40 = absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptorProto_const&)::__0,std::__cxx11::string>
        ;
        make_error.invoker_ =
             absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptorProto_const&)::__0,std::__cxx11::string>
        ;
        make_error.ptr_.obj = local_48.obj;
        element_name._M_str = (pFVar1->name_->_M_dataplus)._M_p;
        element_name._M_len = pFVar1->name_->_M_string_length;
        local_30 = &local_4c;
        AddError(this,element_name,&proto->super_Message,IMPORT,make_error);
        file = file_local;
        break;
      }
    }
  }
  if (file->edition_ == EDITION_PROTO3) {
    ValidateProto3(this,file,proto);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateOptions(const FileDescriptor* file,
                                        const FileDescriptorProto& proto) {
  ValidateFileFeatures(file, proto);

  // Lite files can only be imported by other Lite files.
  if (!IsLite(file)) {
    for (int i = 0; i < file->dependency_count(); i++) {
      if (IsLite(file->dependency(i))) {
        AddError(file->dependency(i)->name(), proto,
                 DescriptorPool::ErrorCollector::IMPORT, [&] {
                   return absl::StrCat(
                       "Files that do not use optimize_for = LITE_RUNTIME "
                       "cannot import files which do use this option.  This "
                       "file is not lite, but it imports \"",
                       file->dependency(i)->name(), "\" which is.");
                 });
        break;
      }
    }
  }
  if (file->edition() == Edition::EDITION_PROTO3) {
    ValidateProto3(file, proto);
  }
}